

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

PatchList re2::PatchList::Append(Inst *inst0,PatchList l1,PatchList l2)

{
  ulong uVar1;
  PatchList PVar2;
  ulong uVar3;
  PatchList PVar4;
  
  PVar4.p = l2.p;
  if ((l1.p != 0) && (uVar1 = (ulong)l1.p, PVar4.p = l1.p, l2.p != 0)) {
    do {
      uVar3 = uVar1;
      PVar2 = Deref(inst0,(uint32)uVar3);
      uVar1 = (ulong)PVar2.p;
    } while (PVar2.p != 0);
    uVar1 = uVar3 >> 1;
    if ((uVar3 & 1) == 0) {
      inst0[uVar1].out_opcode_ = inst0[uVar1].out_opcode_ & 0xf | l2.p << 4;
    }
    else {
      inst0[uVar1].field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)l2.p;
    }
  }
  return (PatchList)PVar4.p;
}

Assistant:

PatchList PatchList::Append(Prog::Inst* inst0, PatchList l1, PatchList l2) {
  if (l1.p == 0)
    return l2;
  if (l2.p == 0)
    return l1;

  PatchList l = l1;
  for (;;) {
    PatchList next = PatchList::Deref(inst0, l);
    if (next.p == 0)
      break;
    l = next;
  }

  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    ip->out1_ = l2.p;
  else
    ip->set_out(l2.p);

  return l1;
}